

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall cmDocumentation::PrintHelpListCommands(cmDocumentation *this,ostream *os)

{
  cmDocumentation *this_00;
  allocator local_31;
  
  this_00 = (cmDocumentation *)&stack0xffffffffffffffd0;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,"command/*",&local_31);
  PrintNames(this_00,os,(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return true;
}

Assistant:

bool cmDocumentation::PrintHelpListCommands(std::ostream& os)
{
  this->PrintNames(os, "command/*");
  return true;
}